

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O0

void __thiscall SqlGenerator::~SqlGenerator(SqlGenerator *this)

{
  SqlGenerator *in_RDI;
  
  ~SqlGenerator(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

SqlGenerator::~SqlGenerator()
{
}